

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::
ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
          (EpsCopyInputStream *this,char *ptr,anon_class_32_4_91646d40 add)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  pair<const_char_*,_int> pVar8;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  undefined2 local_40;
  
  bVar1 = *ptr;
  uVar4 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar8 = ReadSizeFallback(ptr,(uint)bVar1);
    pcVar2 = pVar8.first;
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    uVar4 = pVar8.second;
  }
  else {
    pcVar2 = ptr + 1;
  }
  pcVar5 = this->buffer_end_;
  iVar6 = (int)pcVar5 - (int)pcVar2;
  if (iVar6 < (int)uVar4) {
    do {
      pcVar2 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                         (pcVar2,pcVar5,add);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar5 = this->buffer_end_;
      uVar7 = (int)pcVar2 - (int)pcVar5;
      if (0x10 < uVar7) {
        ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                  ((EpsCopyInputStream *)&local_58);
LAB_002d2ccc:
        ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                  ();
      }
      if ((int)(uVar4 - iVar6) < 0x11) {
        local_48 = (char *)0x0;
        local_40 = 0;
        local_58 = *(char **)pcVar5;
        pcStack_50 = *(char **)(pcVar5 + 8);
        pcVar5 = (char *)((long)&local_58 + (long)(int)(uVar4 - iVar6));
        pcVar2 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                           ((char *)((long)&local_58 + (ulong)(uVar7 & 0x1f)),pcVar5,add);
        if (pcVar2 != pcVar5) {
          return (char *)0x0;
        }
        return this->buffer_end_ + ((long)pcVar2 - (long)&local_58);
      }
      uVar4 = uVar4 - (iVar6 + uVar7);
      if ((int)uVar4 < 1) goto LAB_002d2ccc;
      if (this->limit_ < 0x11) {
        return (char *)0x0;
      }
      pcVar2 = Next(this);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar2 = pcVar2 + (uVar7 & 0x1f);
      pcVar5 = this->buffer_end_;
      iVar6 = (int)pcVar5 - (int)pcVar2;
    } while (iVar6 < (int)uVar4);
  }
  pcVar3 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                     (pcVar2,pcVar2 + (int)uVar4,add);
  pcVar5 = (char *)0x0;
  if (pcVar2 + (int)uVar4 == pcVar3) {
    pcVar5 = pcVar3;
  }
  return pcVar5;
}

Assistant:

[[nodiscard]] const char* ReadPackedVarint(const char* ptr, Add add) {
    return ReadPackedVarint(ptr, add, [](int) {});
  }